

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void resume(lua_State *L,void *ud)

{
  lua_KFunction p_Var1;
  long lVar2;
  int nres;
  CallInfo *pCVar3;
  StkId pSVar4;
  
  nres = *ud;
  pSVar4 = (StkId)((L->top).offset + (long)nres * -0x10);
  if (L->status != '\0') {
    pCVar3 = L->ci;
    L->status = '\0';
    p_Var1 = (pCVar3->u).c.k;
    if ((pCVar3->callstatus & 2) == 0) {
      (pCVar3->u).l.savedpc = (Instruction *)(p_Var1 + -4);
      (L->top).p = pSVar4;
      luaV_execute(L,pCVar3);
    }
    else {
      if (p_Var1 != (lua_KFunction)0x0) {
        nres = (*p_Var1)(L,1,(pCVar3->u).c.ctx);
      }
      luaD_poscall(L,pCVar3,nres);
    }
    unroll(L,pCVar3);
    return;
  }
  pSVar4 = pSVar4 + -1;
  if (199 < (L->nCcalls & 0xfff8)) {
    if ((long)(L->stack_last).p - (L->top).offset < 0x10) {
      lVar2 = (L->stack).offset;
      luaD_growstack(L,0,1);
      pSVar4 = (StkId)(((long)pSVar4 - lVar2) + (long)(L->stack).p);
    }
    luaE_checkcstack(L);
  }
  pCVar3 = luaD_precall(L,pSVar4,-1);
  if (pCVar3 != (CallInfo *)0x0) {
    pCVar3->callstatus = 4;
    luaV_execute(L,pCVar3);
    return;
  }
  return;
}

Assistant:

static void resume (lua_State *L, void *ud) {
  int n = *(cast(int*, ud));  /* number of arguments */
  StkId firstArg = L->top.p - n;  /* first argument */
  CallInfo *ci = L->ci;
  if (L->status == LUA_OK)  /* starting a coroutine? */
    ccall(L, firstArg - 1, LUA_MULTRET, 0);  /* just call its body */
  else {  /* resuming from previous yield */
    lua_assert(L->status == LUA_YIELD);
    L->status = LUA_OK;  /* mark that it is running (again) */
    if (isLua(ci)) {  /* yielded inside a hook? */
      /* undo increment made by 'luaG_traceexec': instruction was not
         executed yet */
      lua_assert(ci->callstatus & CIST_HOOKYIELD);
      ci->u.l.savedpc--;
      L->top.p = firstArg;  /* discard arguments */
      luaV_execute(L, ci);  /* just continue running Lua code */
    }
    else {  /* 'common' yield */
      if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
        lua_unlock(L);
        n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
        lua_lock(L);
        api_checknelems(L, n);
      }
      luaD_poscall(L, ci, n);  /* finish 'luaD_call' */
    }
    unroll(L, NULL);  /* run continuation */
  }
}